

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetAutoUicOptions
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result,string *config)

{
  cmLocalGenerator *lg;
  char *pcVar1;
  string *target;
  cmCompiledGeneratorExpression *this_00;
  allocator local_1b9;
  string local_1b8;
  undefined1 local_198 [8];
  string local_190;
  allocator local_169;
  string local_168;
  undefined1 local_148 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  undefined1 local_80 [8];
  cmGeneratorExpression ge;
  allocator local_49;
  string local_48;
  char *local_28;
  char *prop;
  string *config_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  cmGeneratorTarget *this_local;
  
  prop = (char *)config;
  config_local = (string *)result;
  result_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"AUTOUIC_OPTIONS",&local_49);
  pcVar1 = GetLinkInterfaceDependentStringProperty(this,&local_48,(string *)prop);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (pcVar1 != (char *)0x0) {
    local_28 = pcVar1;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&dagChecker.CheckResult);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_80,(cmListFileBacktrace *)&dagChecker.CheckResult);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&dagChecker.CheckResult);
    target = GetName_abi_cxx11_(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,"AUTOUIC_OPTIONS",&local_169);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_148,target,&local_168,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_198,local_80);
    this_00 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                        ((auto_ptr<cmCompiledGeneratorExpression> *)local_198);
    pcVar1 = prop;
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_1b8);
    pcVar1 = cmCompiledGeneratorExpression::Evaluate
                       (this_00,lg,(string *)pcVar1,false,this,
                        (cmGeneratorExpressionDAGChecker *)local_148,&local_1b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_198 + 8),pcVar1,&local_1b9);
    cmSystemTools::ExpandListArgument
              ((string *)(local_198 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)config_local,false);
    std::__cxx11::string::~string((string *)(local_198 + 8));
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    std::__cxx11::string::~string((string *)&local_1b8);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_198);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_148);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_80);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetAutoUicOptions(std::vector<std::string>& result,
                                          const std::string& config) const
{
  const char* prop =
    this->GetLinkInterfaceDependentStringProperty("AUTOUIC_OPTIONS", config);
  if (!prop) {
    return;
  }
  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(
    this->GetName(), "AUTOUIC_OPTIONS", CM_NULLPTR, CM_NULLPTR);
  cmSystemTools::ExpandListArgument(
    ge.Parse(prop)->Evaluate(this->LocalGenerator, config, false, this,
                             &dagChecker),
    result);
}